

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O1

void re2c::emit_action(Action *action,OutputFile *o,uint32_t ind,bool *readCh,State *s,
                      string *condName,Skeleton *skeleton,
                      set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                      *used_labels,bool save_yyaccept)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  Initial *__k;
  pointer ppSVar3;
  pointer ppSVar4;
  RuleOp *pRVar5;
  size_t sVar6;
  size_t __n;
  pointer pcVar7;
  int iVar8;
  const_iterator cVar9;
  OutputFile *pOVar10;
  opt_t *poVar11;
  opt_t *poVar12;
  size_t n;
  undefined1 *puVar13;
  State *value;
  undefined1 *puVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  accept_t *accepts;
  uint uVar17;
  bool bVar18;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  State *local_a0;
  accept_t *local_98;
  undefined1 *local_90;
  long *local_88 [2];
  long local_78 [2];
  uint32_t local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  realopt_t *local_38;
  
  switch(action->type) {
  case MATCH:
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar12->target == DOT) break;
    if (s == (State *)0x0) {
      bVar18 = false;
    }
    else if (s->next == (State *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = (s->next->action).type != RULE;
    }
    if (s->fill == 0) {
      if (bVar18) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        *readCh = false;
      }
      else {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_skip_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        *readCh = true;
      }
    }
    else {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      InputAPI::stmt_skip_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    n = s->fill;
    if (n == 0) break;
    goto LAB_0011b113;
  case INITIAL:
    __k = (action->info).initial;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar12->target == DOT) break;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)readCh;
    cVar9 = std::
            _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
            ::find(&used_labels->_M_t,&s->label);
    p_Var1 = &(used_labels->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
      if (s->fill == 0) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
      }
      else {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_skip_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    cVar9 = std::
            _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
            ::find(&used_labels->_M_t,&__k->label);
    if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar10 = OutputFile::wstring(o,&poVar12->labelPrefix);
      pOVar10 = OutputFile::wlabel(pOVar10,(label_t)(__k->label).value);
      OutputFile::ws(pOVar10,":\n");
    }
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar12->dFlag == true) {
      pOVar10 = OutputFile::wind(o,ind);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yydebug);
      pOVar10 = OutputFile::ws(pOVar10,"(");
      pOVar10 = OutputFile::wlabel(pOVar10,(label_t)(__k->label).value);
      pOVar10 = OutputFile::ws(pOVar10,", *");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yycursor);
      OutputFile::ws(pOVar10,");\n");
    }
    pbVar15 = local_a8;
    n = s->fill;
    bVar18 = __k->setMarker;
    readCh = (bool *)local_a8;
    if (n == 0) {
      if (bVar18 != false) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_backup_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      *(bool *)&(pbVar15->_M_dataplus)._M_p = false;
      break;
    }
    goto LAB_0011b116;
  case SAVE:
    uVar2 = (action->info).save;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar12->target == DOT) break;
    if (save_yyaccept) {
      pOVar10 = OutputFile::wind(o,ind);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yyaccept);
      pOVar10 = OutputFile::ws(pOVar10," = ");
      pOVar10 = OutputFile::wu32(pOVar10,uVar2);
      OutputFile::ws(pOVar10,";\n");
    }
    if (s->fill == 0) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      InputAPI::stmt_skip_backup_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      *readCh = false;
      break;
    }
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    InputAPI::stmt_skip_backup_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
    OutputFile::wstring(o,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    n = s->fill;
LAB_0011b113:
    bVar18 = false;
LAB_0011b116:
    need(o,ind,readCh,n,bVar18);
    break;
  case ACCEPT:
    accepts = (action->info).accepts;
    ppSVar3 = (accepts->elems).
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppSVar4 = (accepts->elems).
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppSVar3 != ppSVar4) {
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)ppSVar3 - (long)ppSVar4);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      if (poVar12->target != DOT) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_restore_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if (*readCh == true) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        *readCh = false;
      }
      if ((long)ppSVar3 - (long)ppSVar4 == 8) {
        genGoTo(o,ind,s,*(accepts->elems).
                         super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,readCh);
      }
      else {
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_a8 >> 3);
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        if ((poVar12->gFlag == true) &&
           (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868),
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)poVar12->cGotoThreshold <= local_a8)) {
          local_a0 = s;
          pOVar10 = OutputFile::wind(o,ind);
          OutputFile::ws(pOVar10,"{\n");
          local_90 = (undefined1 *)CONCAT44(local_90._4_4_,ind + 2);
          local_64 = ind + 1;
          local_40 = (ulong)ind;
          pOVar10 = OutputFile::wind(o,ind + 1);
          pOVar10 = OutputFile::ws(pOVar10,"static void *");
          local_38 = (realopt_t *)&DAT_0015d868;
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yytarget);
          pOVar10 = OutputFile::ws(pOVar10,"[");
          pbVar15 = local_a8;
          pOVar10 = OutputFile::wu64(pOVar10,(uint64_t)local_a8);
          OutputFile::ws(pOVar10,"] = {\n");
          uVar17 = 1;
          pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          do {
            pOVar10 = OutputFile::wind(o,(uint32_t)local_90);
            pOVar10 = OutputFile::ws(pOVar10,"&&");
            poVar12 = realopt_t::operator->(local_38);
            pOVar10 = OutputFile::wstring(pOVar10,&poVar12->labelPrefix);
            pOVar10 = OutputFile::wlabel(pOVar10,(label_t)((accepts->elems).
                                                                                                                      
                                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)pbVar16]->label).value);
            OutputFile::ws(pOVar10,",\n");
            uVar2 = local_64;
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (ulong)uVar17;
            uVar17 = uVar17 + 1;
          } while (pbVar16 < pbVar15);
          pOVar10 = OutputFile::wind(o,local_64);
          OutputFile::ws(pOVar10,"};\n");
          pOVar10 = OutputFile::wind(o,uVar2);
          pOVar10 = OutputFile::ws(pOVar10,"goto *");
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yytarget);
          pOVar10 = OutputFile::ws(pOVar10,"[");
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yyaccept);
          OutputFile::ws(pOVar10,"];\n");
          ind = (uint32_t)local_40;
          pOVar10 = OutputFile::wind(o,ind);
          OutputFile::ws(pOVar10,"}\n");
          s = local_a0;
        }
        else {
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          if ((poVar12->sFlag == false) &&
             (((long)ppSVar3 - (long)ppSVar4 != 0x10 ||
              (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar12->target == DOT))
             )) {
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
            if (poVar12->target == DOT) {
              uVar17 = 1;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_98 = accepts;
              do {
                pOVar10 = OutputFile::wlabel(o,(label_t)(s->label).value);
                pOVar10 = OutputFile::ws(pOVar10," -> ");
                OutputFile::wlabel(pOVar10,(label_t)((local_98->elems).
                                                                                                          
                                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)pbVar15]->label).value);
                pOVar10 = OutputFile::ws(o," [label=\"yyaccept=");
                pOVar10 = OutputFile::wu32(pOVar10,uVar17 - 1);
                OutputFile::ws(pOVar10,"\"]\n");
                pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ulong)uVar17;
                uVar17 = uVar17 + 1;
              } while (pbVar15 < local_a8);
            }
            else {
              pOVar10 = OutputFile::wind(o,ind);
              pOVar10 = OutputFile::ws(pOVar10,"switch (");
              poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
              pOVar10 = OutputFile::wstring(pOVar10,&poVar12->yyaccept);
              OutputFile::ws(pOVar10,") {\n");
              puVar13 = (undefined1 *)((long)&local_a8[-1].field_2 + 0xf);
              local_a0 = s;
              if (puVar13 != (undefined1 *)0x0) {
                uVar17 = 1;
                puVar14 = (undefined1 *)0x0;
                local_98 = accepts;
                local_90 = puVar13;
                do {
                  pOVar10 = OutputFile::wind(o,ind);
                  pOVar10 = OutputFile::ws(pOVar10,"case ");
                  accepts = local_98;
                  pOVar10 = OutputFile::wu32(pOVar10,uVar17 - 1);
                  OutputFile::ws(pOVar10,": \t");
                  genGoTo(o,0,local_a0,
                          (accepts->elems).
                          super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)puVar14],readCh);
                  puVar14 = (undefined1 *)(ulong)uVar17;
                  uVar17 = uVar17 + 1;
                } while (puVar14 < local_90);
              }
              pOVar10 = OutputFile::wind(o,ind);
              OutputFile::ws(pOVar10,"default:\t");
              s = local_a0;
              genGoTo(o,0,local_a0,
                      (accepts->elems).
                      super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [(long)((long)&local_a8[-1].field_2._M_allocated_capacity + 0xf)],readCh);
              pOVar10 = OutputFile::wind(o,ind);
              OutputFile::ws(pOVar10,"}\n");
            }
          }
          else {
            emit_accept_binary(o,ind,readCh,s,accepts,0,(size_t)((long)&local_a8[-1].field_2 + 0xf))
            ;
          }
        }
      }
    }
    break;
  case RULE:
    pRVar5 = (action->info).rule;
    value = s;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar12->target == DOT) {
      OutputFile::wlabel(o,(label_t)(s->label).value);
      if (pRVar5->code != (Code *)0x0) {
        pOVar10 = OutputFile::ws(o," [label=\"");
        pOVar10 = OutputFile::wstring(pOVar10,(string *)pRVar5->code);
        pOVar10 = OutputFile::ws(pOVar10,":");
        pOVar10 = OutputFile::wu32(pOVar10,(pRVar5->code->loc).line);
        OutputFile::ws(pOVar10,"\"]");
      }
      OutputFile::ws(o,"\n");
    }
    else {
      iVar8 = (*pRVar5->ctx->_vptr_RegExp[4])();
      if ((iVar8 != 0) &&
         (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar12->target != DOT)) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        InputAPI::stmt_restorectx_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      if (poVar12->target == SKELETON) {
        Skeleton::emit_action(skeleton,o,ind,(rule_rank_t)(pRVar5->rank).value);
      }
      else {
        local_a8 = &pRVar5->newcond;
        sVar6 = (pRVar5->newcond)._M_string_length;
        if ((sVar6 != 0) &&
           ((__n = condName->_M_string_length, __n != sVar6 ||
            ((__n != 0 &&
             (iVar8 = bcmp((condName->_M_dataplus)._M_p,(local_a8->_M_dataplus)._M_p,__n),
             iVar8 != 0)))))) {
          pOVar10 = OutputFile::wind(o,ind);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          local_88[0] = local_78;
          pcVar7 = (poVar12->cond_set)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_88,pcVar7,pcVar7 + (poVar12->cond_set)._M_string_length);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          poVar11 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          std::operator+(&local_60,&poVar11->condEnumPrefix,local_a8);
          replaceParam<std::__cxx11::string>
                    (&local_c8,(re2c *)local_88,&poVar12->cond_set_arg,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
          OutputFile::wstring(pOVar10,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if (local_88[0] != local_78) {
            operator_delete(local_88[0],local_78[0] + 1);
          }
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          if (poVar12->cond_set_naked == false) {
            pOVar10 = OutputFile::ws(o,"(");
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
            pOVar10 = OutputFile::wstring(pOVar10,&poVar12->condEnumPrefix);
            pOVar10 = OutputFile::wstring(pOVar10,local_a8);
            OutputFile::ws(pOVar10,");");
          }
          OutputFile::ws(o,"\n");
        }
        if (pRVar5->code == (Code *)0x0) {
          if ((pRVar5->newcond)._M_string_length != 0) {
            pOVar10 = OutputFile::wind(o,ind);
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
            pcVar7 = (poVar12->condGoto)._M_dataplus._M_p;
            local_88[0] = local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_88,pcVar7,pcVar7 + (poVar12->condGoto)._M_string_length);
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
            poVar11 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
            std::operator+(&local_60,&poVar11->condPrefix,local_a8);
            replaceParam<std::__cxx11::string>
                      (&local_c8,(re2c *)local_88,&poVar12->condGotoParam,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
            pOVar10 = OutputFile::wstring(pOVar10,&local_c8);
            OutputFile::ws(pOVar10,"\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (local_88[0] != local_78) {
              operator_delete(local_88[0],local_78[0] + 1);
            }
          }
        }
        else {
          if (yySetupRule_abi_cxx11_._8_8_ != 0) {
            pOVar10 = OutputFile::wind(o,ind);
            pOVar10 = OutputFile::wstring(pOVar10,(string *)yySetupRule_abi_cxx11_);
            OutputFile::ws(pOVar10,"\n");
          }
          pOVar10 = OutputFile::wline_info
                              (o,(pRVar5->code->loc).line,
                               (pRVar5->code->loc).filename._M_dataplus._M_p);
          pOVar10 = OutputFile::wind(pOVar10,ind);
          pOVar10 = OutputFile::wstring(pOVar10,&pRVar5->code->text);
          pOVar10 = OutputFile::ws(pOVar10,"\n");
          OutputFile::wdelay_line_info(pOVar10);
        }
      }
    }
  }
  if ((s->isPreCtxt == true) &&
     (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar12->target != DOT)) {
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    InputAPI::stmt_backupctx_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
    OutputFile::wstring(o,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void emit_action
	( const Action & action
	, OutputFile & o
	, uint32_t ind
	, bool & readCh
	, const State * const s
	, const std::string & condName
	, const Skeleton * skeleton
	, const std::set<label_t> & used_labels
	, bool save_yyaccept
	)
{
	switch (action.type)
	{
		case Action::MATCH:
			emit_match (o, ind, readCh, s);
			break;
		case Action::INITIAL:
			emit_initial (o, ind, readCh, s, * action.info.initial, used_labels);
			break;
		case Action::SAVE:
			emit_save (o, ind, readCh, s, action.info.save, save_yyaccept);
			break;
		case Action::MOVE:
			break;
		case Action::ACCEPT:
			emit_accept (o, ind, readCh, s, * action.info.accepts);
			break;
		case Action::RULE:
			emit_rule (o, ind, s, action.info.rule, condName, skeleton);
			break;
	}
	if (s->isPreCtxt && opts->target != opt_t::DOT)
	{
		o.wstring(opts->input_api.stmt_backupctx (ind));
	}
}